

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::GetAccessors
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var *getter,Var *setter)

{
  code *pcVar1;
  DynamicObject *pDVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  Var pvVar6;
  ArrayObject *pAVar7;
  ArrayObject *objectArray;
  PropertyRecord *pPStack_50;
  bool getset;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext;
  DictionaryPropertyDescriptor<int> *descriptor;
  Var *setter_local;
  Var *getter_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  descriptor = (DictionaryPropertyDescriptor<int> *)setter;
  setter_local = getter;
  getter_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  propertyRecord =
       (PropertyRecord *)RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  if ((setter_local == (Var *)0x0) || (descriptor == (DictionaryPropertyDescriptor<int> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x622,"(nullptr != getter && nullptr != setter)",
                                "Getter/Setter must be a valid pointer");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (getter_local._4_4_ == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x624,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pPStack_50 = ScriptContext::GetPropertyName((ScriptContext *)propertyRecord,getter_local._4_4_);
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_00,&stack0xffffffffffffffb0,
                     (DictionaryPropertyDescriptor<int> **)&scriptContext);
  if (bVar3) {
    if (((ulong)(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo & 0x800) != 0) {
      return 0;
    }
    iVar4 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>
                      ((DictionaryPropertyDescriptor<int> *)scriptContext);
    if (iVar4 == -1) {
      iVar4 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex
                        ((DictionaryPropertyDescriptor<int> *)scriptContext);
      pDVar2 = pDStack_20;
      objectArray._7_1_ = iVar4 != -1;
      if (objectArray._7_1_) {
        iVar4 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex
                          ((DictionaryPropertyDescriptor<int> *)scriptContext);
        pvVar6 = DynamicObject::GetSlot(pDVar2,iVar4);
        *setter_local = pvVar6;
        descriptor->flags = None;
        descriptor->Attributes = '\0';
        *(undefined2 *)&descriptor->field_0x2 = 0;
        descriptor->Data = 0;
      }
      iVar4 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex
                        ((DictionaryPropertyDescriptor<int> *)scriptContext);
      pDVar2 = pDStack_20;
      if (iVar4 != -1) {
        iVar4 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex
                          ((DictionaryPropertyDescriptor<int> *)scriptContext);
        pvVar6 = DynamicObject::GetSlot(pDVar2,iVar4);
        *(Var *)descriptor = pvVar6;
        if (!objectArray._7_1_) {
          *setter_local = (Var)0x0;
        }
        objectArray._7_1_ = true;
      }
      return (uint)objectArray._7_1_;
    }
  }
  bVar3 = PropertyRecord::IsNumeric(pPStack_50);
  if ((bVar3) && (pAVar7 = DynamicObject::GetObjectArray(pDStack_20), pAVar7 != (ArrayObject *)0x0))
  {
    this_local._4_4_ =
         (*(pAVar7->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x15])
                   (pAVar7,(ulong)getter_local._4_4_,setter_local,descriptor,propertyRecord);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::GetAccessors(DynamicObject* instance, PropertyId propertyId, _Outptr_result_maybenull_ Var* getter, _Outptr_result_maybenull_ Var* setter)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        AssertMsg(nullptr != getter && nullptr != setter, "Getter/Setter must be a valid pointer");

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return false;
            }

            if (descriptor->template GetDataPropertyIndex<false>() == NoSlots)
            {
                bool getset = false;
                if (descriptor->GetGetterPropertyIndex() != NoSlots)
                {
                    *getter = instance->GetSlot(descriptor->GetGetterPropertyIndex());
                    *setter = nullptr;
                    getset = true;
                }
                if (descriptor->GetSetterPropertyIndex() != NoSlots)
                {
                    *setter = instance->GetSlot(descriptor->GetSetterPropertyIndex());
                    if(!getset) {
                        // if we didn't set the getter above, we need to set it here
                        *getter = nullptr;
                    }
                    getset = true;
                }
                return getset;
            }
        }

        // Check numeric propertyRecord only if objectArray available
        if (propertyRecord->IsNumeric())
        {
            ArrayObject * objectArray = instance->GetObjectArray();
            if (objectArray != nullptr)
            {
                return objectArray->GetAccessors(propertyId, getter, setter, scriptContext);
            }
        }

        return false;
    }